

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_pgroup_set_default(Integer grp)

{
  int in_EDI;
  ARMCI_Group parent_grp;
  ARMCI_Group local_c [3];
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  GA_Default_Proc_Group = in_EDI;
  if (in_EDI < 1) {
    ARMCI_Group_get_world(local_c);
  }
  else {
    local_c[0] = PGRP_LIST[in_EDI].group;
  }
  ARMCI_Group_set_default(local_c);
  return;
}

Assistant:

void pnga_pgroup_set_default(Integer grp)
{
#if 0
    int local_sync_begin,local_sync_end;
 
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
#endif
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
 
    /* force a hang if default group is not being set correctly */
#if 0
    if (local_sync_begin || local_sync_end) pnga_pgroup_sync(grp);
#endif
    GA_Default_Proc_Group = (int)(grp);

#ifdef MSG_COMMS_MPI
    {
       ARMCI_Group parent_grp;
       if(GA_Default_Proc_Group > 0)
          parent_grp = PGRP_LIST[GA_Default_Proc_Group].group;
       else
          ARMCI_Group_get_world(&parent_grp);  
       ARMCI_Group_set_default(&parent_grp);
    }
#endif
}